

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O1

void test_secp256r1_sign(void)

{
  int iVar1;
  uECC_Curve curve;
  ptls_t *tls;
  ptls_iovec_t input;
  uint16_t local_2cc;
  uint16_t selected;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t signer;
  ptls_buffer_t sigbuf;
  uint8_t pub [65];
  uint32_t sigbuf_small [128];
  
  tls = (ptls_t *)signer.key;
  signer.key[0x18] = '\0';
  signer.key[0x19] = '\0';
  signer.key[0x1a] = '\0';
  signer.key[0x1b] = '\0';
  signer.key[0x1c] = '\0';
  signer.key[0x1d] = '\0';
  signer.key[0x1e] = '\0';
  signer.key[0x1f] = '\0';
  signer.key[8] = '\0';
  signer.key[9] = '\0';
  signer.key[10] = '\0';
  signer.key[0xb] = '\0';
  signer.key[0xc] = '\0';
  signer.key[0xd] = '\0';
  signer.key[0xe] = '\0';
  signer.key[0xf] = '\0';
  signer.key[0x10] = '\0';
  signer.key[0x11] = '\0';
  signer.key[0x12] = '\0';
  signer.key[0x13] = '\0';
  signer.key[0x14] = '\0';
  signer.key[0x15] = '\0';
  signer.key[0x16] = '\0';
  signer.key[0x17] = '\0';
  signer.super.cb = secp256r1sha256_sign;
  signer.key[0] = '\0';
  signer.key[1] = '\0';
  signer.key[2] = '\0';
  signer.key[3] = '\0';
  signer.key[4] = '\0';
  signer.key[5] = '\0';
  signer.key[6] = '\0';
  signer.key[7] = '\0';
  curve = uECC_secp256r1();
  uECC_make_key(pub,(uint8_t *)tls,curve);
  sigbuf.base = (uint8_t *)sigbuf_small;
  sigbuf.off = 0;
  sigbuf.capacity = 0x200;
  sigbuf.is_allocated = 0;
  local_2cc = 0x403;
  input.len = 0x20;
  input.base = (uint8_t *)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
  iVar1 = secp256r1sha256_sign(&signer.super,tls,&selected,&sigbuf,input,&local_2cc,1);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x3a);
  _ok((uint)(selected == 0x403),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x3b);
  ptls_buffer__release_memory(&sigbuf);
  return;
}

Assistant:

static void test_secp256r1_sign(void)
{
    const char *msg = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
    ptls_minicrypto_secp256r1sha256_sign_certificate_t signer = {{secp256r1sha256_sign}};
    uint8_t pub[SECP256R1_PUBLIC_KEY_SIZE];
    uint16_t selected;
    ptls_buffer_t sigbuf;
    uint32_t sigbuf_small[128];

    uECC_make_key(pub, signer.key, uECC_secp256r1());
    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));

    ok(secp256r1sha256_sign(&signer.super, NULL, &selected, &sigbuf, ptls_iovec_init(msg, 32),
                            (uint16_t[]){PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256}, 1) == 0);
    ok(selected == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);

    /* FIXME verify sign */

    ptls_buffer_dispose(&sigbuf);
}